

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.c
# Opt level: O2

int makeDots(float radius,point3d *points,int maxpnts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  long lVar16;
  double dVar17;
  double dStack_80;
  
  dVar17 = (double)maxpnts * 3.14159265359;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar17 = floor(dVar17);
  iVar10 = (int)dVar17 / 2;
  iVar8 = -1;
  if (-1 < iVar10) {
    iVar8 = iVar10;
  }
  iVar13 = 0;
  iVar11 = 0;
  bVar9 = true;
  do {
    if (iVar11 == iVar8 + 1) {
      return iVar13;
    }
    dVar3 = ((double)iVar11 * 3.14159265359) / (double)iVar10;
    dVar4 = cos(dVar3);
    dVar4 = dVar4 * (double)radius;
    dVar5 = sin(dVar3);
    dVar5 = dVar5 * (double)radius;
    dVar3 = sin(dVar3);
    dVar3 = floor(dVar3 * (double)(int)dVar17);
    iVar12 = (int)dVar3;
    if (iVar12 < 2) {
      iVar12 = 1;
    }
    dVar3 = dVar4 * -0.043619387365338866;
    dVar4 = dVar4 * 0.9990482215818577;
    auVar1._8_4_ = SUB84(dVar4,0);
    auVar1._0_8_ = dVar3;
    auVar1._12_4_ = (int)((ulong)dVar4 >> 0x20);
    lVar16 = (long)iVar13;
    pdVar15 = &points[lVar16].y;
    dVar4 = 0.0;
    for (iVar14 = 0; -iVar12 != iVar14; iVar14 = iVar14 + -1) {
      dVar7 = dVar4 * 6.28318530718;
      if (bVar9) {
        dVar7 = dVar4 * 6.28318530718 + 0.20000000298023224;
      }
      dVar6 = cos(dVar7 / (double)iVar12);
      dVar7 = sin(dVar7 / (double)iVar12);
      if (maxpnts <= lVar16) {
        return iVar13 - iVar14;
      }
      dVar7 = dVar7 * dVar5;
      ((point3d *)(pdVar15 + -1))->x = dVar6 * dVar5;
      dStack_80 = auVar1._8_8_;
      dStack_80 = dVar7 * 0.043619387365338866 + dStack_80;
      auVar2._8_4_ = SUB84(dStack_80,0);
      auVar2._0_8_ = dVar7 * 0.9990482215818577 + dVar3;
      auVar2._12_4_ = (int)((ulong)dStack_80 >> 0x20);
      *(undefined1 (*) [16])pdVar15 = auVar2;
      lVar16 = lVar16 + 1;
      dVar4 = dVar4 + 1.0;
      pdVar15 = pdVar15 + 3;
    }
    iVar13 = iVar13 - iVar14;
    bVar9 = (bool)(bVar9 ^ 1);
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

int makeDots(float radius, point3d points[], int maxpnts) {
   float offset = 0.2;
   double ang, cosang, sinang, phi, theta, xy0, x0, y0, z0;
   int i, j, k, odd, nequator, nvert, nhoriz;

   nequator = (int)floor(sqrt(maxpnts * PI));

   odd = 1;
   ang = 5.0 * PI / 360.0;
   cosang = cos(ang);
   sinang = sin(ang);

   i = 0;
   nvert = nequator / 2;
   for (j = 0; j <= nvert; j++) {
      phi = (PI * j) / nvert;
      z0 = cos(phi) * radius;
      xy0= sin(phi) * radius;

      nhoriz = (int)floor(nequator * sin(phi));
      if (nhoriz < 1) nhoriz = 1;
      for (k = 0; k < nhoriz; k++) {
	 if(odd) {theta = (2.0 * PI * k + offset)/nhoriz; }
	 else    {theta = (2.0 * PI * k         )/nhoriz; }
	 x0 = cos(theta) * xy0;
	 y0 = sin(theta) * xy0;

	 if (i >= maxpnts) return i;
	 points[i].x = x0;
	 points[i].y = y0*cosang - z0*sinang;
	 points[i].z = y0*sinang + z0*cosang;
	 i++;
      }
      odd = !odd;
   }
   return i;
}